

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_utils_basis.h
# Opt level: O3

BasisCodec __thiscall
ktx::OptionsEncodeBasis<true>::validateBasisCodec
          (OptionsEncodeBasis<true> *this,OptionValue *codecOpt)

{
  pointer pcVar1;
  size_type sVar2;
  int iVar3;
  BasisCodec BVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  const_iterator cVar6;
  size_type sVar7;
  long lVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  undefined1 local_9b;
  undefined1 local_9a;
  undefined1 local_99;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  size_type local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  BasisCodec local_78 [2];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx::BasisCodec>
  local_70;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx::BasisCodec>
  local_48;
  
  if ((validateBasisCodec(cxxopts::OptionValue_const&)::codecs_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&validateBasisCodec(cxxopts::OptionValue_const&)::
                                   codecs_abi_cxx11_), iVar3 != 0)) {
    local_78[1] = 1;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx::BasisCodec>
    ::pair<const_char_(&)[9],_ktx::BasisCodec,_true>
              (&local_70,(char (*) [9])"basis-lz",local_78 + 1);
    local_78[0] = UASTC;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx::BasisCodec>
    ::pair<const_char_(&)[6],_ktx::BasisCodec,_true>(&local_48,(char (*) [6])0x204005,local_78);
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,ktx::BasisCodec>,std::allocator<std::pair<std::__cxx11::string_const,ktx::BasisCodec>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_Hashtable<std::pair<std::__cxx11::string_const,ktx::BasisCodec>const*>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,ktx::BasisCodec>,std::allocator<std::pair<std::__cxx11::string_const,ktx::BasisCodec>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&validateBasisCodec(cxxopts::OptionValue_const&)::codecs_abi_cxx11_,&local_70,
               &stack0xffffffffffffffe0,0,&local_99,&local_9a,&local_9b);
    lVar8 = -0x50;
    paVar9 = &local_48.first.field_2;
    do {
      if (paVar9 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(&paVar9->_M_allocated_capacity)[-2]) {
        operator_delete((long *)(&paVar9->_M_allocated_capacity)[-2],
                        paVar9->_M_allocated_capacity + 1);
      }
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(&paVar9->_M_allocated_capacity + -5);
      lVar8 = lVar8 + 0x28;
    } while (lVar8 != 0);
    __cxa_atexit(std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx::BasisCodec,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx::BasisCodec>_>_>
                 ::~unordered_map,
                 &validateBasisCodec(cxxopts::OptionValue_const&)::codecs_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&validateBasisCodec(cxxopts::OptionValue_const&)::codecs_abi_cxx11_);
  }
  if (codecOpt->m_count == 0) {
    BVar4 = NONE;
  }
  else {
    pbVar5 = cxxopts::OptionValue::as<std::__cxx11::string>(codecOpt);
    pcVar1 = (pbVar5->_M_dataplus)._M_p;
    local_98 = &local_88;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,pcVar1,pcVar1 + pbVar5->_M_string_length);
    sVar2 = local_90;
    paVar9 = local_98;
    if (local_90 != 0) {
      sVar7 = 0;
      do {
        iVar3 = tolower((int)paVar9->_M_local_buf[sVar7]);
        paVar9->_M_local_buf[sVar7] = (char)iVar3;
        sVar7 = sVar7 + 1;
      } while (sVar2 != sVar7);
    }
    paVar9 = &local_70.first.field_2;
    local_70.first._M_dataplus._M_p = (pointer)local_98;
    if (local_98 == &local_88) {
      local_70.first.field_2._8_8_ = local_88._8_8_;
      local_70.first._M_dataplus._M_p = (pointer)paVar9;
    }
    local_70.first.field_2._M_allocated_capacity._1_7_ = local_88._M_allocated_capacity._1_7_;
    local_70.first.field_2._M_local_buf[0] = local_88._M_local_buf[0];
    local_70.first._M_string_length = local_90;
    local_90 = 0;
    local_88._M_local_buf[0] = '\0';
    local_98 = &local_88;
    cVar6 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx::BasisCodec>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx::BasisCodec>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&validateBasisCodec(cxxopts::OptionValue_const&)::codecs_abi_cxx11_._M_h,
                   &local_70.first);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70.first._M_dataplus._M_p != paVar9) {
      operator_delete(local_70.first._M_dataplus._M_p,
                      local_70.first.field_2._M_allocated_capacity + 1);
    }
    if (local_98 != &local_88) {
      operator_delete(local_98,CONCAT71(local_88._M_allocated_capacity._1_7_,
                                        local_88._M_local_buf[0]) + 1);
    }
    if (cVar6.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx::BasisCodec>,_true>
        ._M_cur == (__node_type *)0x0) {
      BVar4 = INVALID;
    }
    else {
      BVar4 = *(BasisCodec *)
               ((long)cVar6.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx::BasisCodec>,_true>
                      ._M_cur + 0x28);
    }
  }
  return BVar4;
}

Assistant:

BasisCodec validateBasisCodec(const cxxopts::OptionValue& codecOpt) const {
        static const std::unordered_map<std::string, BasisCodec> codecs = {
            { "basis-lz", BasisCodec::BasisLZ },
            { "uastc", BasisCodec::UASTC }
        };
        if (codecOpt.count()) {
            auto it = codecs.find(to_lower_copy(codecOpt.as<std::string>()));
            if (it != codecs.end()) {
                return it->second;
            } else {
                return BasisCodec::INVALID;
            }
        } else {
            return BasisCodec::NONE;
        }
    }